

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::numparse::impl::AffixMatcher::toString
          (UnicodeString *__return_storage_ptr__,AffixMatcher *this)

{
  char16_t *text;
  UnicodeString UStack_298;
  UnicodeString local_258;
  UnicodeString local_218;
  UnicodeString local_1d8;
  UnicodeString local_198;
  UnicodeString local_158;
  UnicodeString local_118;
  UnicodeString local_d8;
  UnicodeString local_98;
  UnicodeString local_58;
  
  text = L":negative ";
  if ((this->fFlags & 1) == 0) {
    text = L" ";
  }
  UnicodeString::UnicodeString(&local_158,L"<Affix");
  UnicodeString::UnicodeString(&local_198,text);
  operator+(&local_118,&local_158,&local_198);
  if (this->fPrefix == (AffixPatternMatcher *)0x0) {
    UnicodeString::UnicodeString(&local_258,L"null");
  }
  else {
    AffixPatternMatcher::getPattern(&local_258,this->fPrefix);
  }
  operator+(&local_d8,&local_118,&local_258);
  UnicodeString::UnicodeString(&local_1d8,L"#");
  operator+(&local_98,&local_d8,&local_1d8);
  if (this->fSuffix == (AffixPatternMatcher *)0x0) {
    UnicodeString::UnicodeString(&UStack_298,L"null");
  }
  else {
    AffixPatternMatcher::getPattern(&UStack_298,this->fSuffix);
  }
  operator+(&local_58,&local_98,&UStack_298);
  UnicodeString::UnicodeString(&local_218,L">");
  operator+(__return_storage_ptr__,&local_58,&local_218);
  UnicodeString::~UnicodeString(&local_218);
  UnicodeString::~UnicodeString(&local_58);
  UnicodeString::~UnicodeString(&UStack_298);
  UnicodeString::~UnicodeString(&local_98);
  UnicodeString::~UnicodeString(&local_1d8);
  UnicodeString::~UnicodeString(&local_d8);
  UnicodeString::~UnicodeString(&local_258);
  UnicodeString::~UnicodeString(&local_118);
  UnicodeString::~UnicodeString(&local_198);
  UnicodeString::~UnicodeString(&local_158);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString AffixMatcher::toString() const {
    bool isNegative = 0 != (fFlags & FLAG_NEGATIVE);
    return UnicodeString(u"<Affix") + (isNegative ? u":negative " : u" ") +
           (fPrefix ? fPrefix->getPattern() : u"null") + u"#" +
           (fSuffix ? fSuffix->getPattern() : u"null") + u">";

}